

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O3

void __thiscall sftm::CTaskManager::Stop(CTaskManager *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  timespec local_38;
  
  uVar1 = this->m_nWorkerCount;
  if (uVar1 != 0) {
    uVar4 = 1;
    do {
      (this->m_workers)._M_elems[uVar4].m_bStopping = true;
      uVar4 = uVar4 + 1;
    } while (uVar4 <= uVar1);
    if (uVar1 != 0) {
      uVar5 = 1;
      do {
        if ((this->m_workers)._M_elems[uVar5].m_bFinished == false) {
          do {
            local_38.tv_sec = 0;
            local_38.tv_nsec = 10000000;
            do {
              iVar2 = nanosleep(&local_38,&local_38);
              if (iVar2 != -1) break;
              piVar3 = __errno_location();
            } while (*piVar3 == 4);
            std::condition_variable::notify_all();
          } while ((this->m_workers)._M_elems[uVar5].m_bFinished != true);
          uVar1 = this->m_nWorkerCount;
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 <= uVar1);
    }
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 1; nWorker <= m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}